

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O2

coda_product_class * coda_data_dictionary_get_product_class(char *name)

{
  long lVar1;
  coda_product_class *pcVar2;
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + -0x11f0) == 0) {
    pcVar2 = (coda_product_class *)0x0;
    coda_set_error(-400,"coda has not been initialized");
  }
  else {
    lVar1 = coda_hashtable_get_index_from_name
                      (*(hashtable **)(*(long *)(in_FS_OFFSET + -0x11f0) + 0x10),name);
    if ((int)lVar1 == -1) {
      pcVar2 = (coda_product_class *)0x0;
      coda_set_error(-400,"data dictionary does not contain a product class with name %s",name);
    }
    else {
      pcVar2 = *(coda_product_class **)
                (*(long *)(*(long *)(in_FS_OFFSET + -0x11f0) + 8) + (long)(int)lVar1 * 8);
    }
  }
  return pcVar2;
}

Assistant:

coda_product_class *coda_data_dictionary_get_product_class(const char *name)
{
    int index;

    if (coda_global_data_dictionary == NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "coda has not been initialized");
        return NULL;
    }

    index = hashtable_get_index_from_name(coda_global_data_dictionary->hash_data, name);
    if (index == -1)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "data dictionary does not contain a product class with name %s",
                       name);
        return NULL;
    }

    return coda_global_data_dictionary->product_class[index];
}